

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdapStrategy.cpp
# Opt level: O1

optional<Vault::AuthenticationResponse> * __thiscall
Vault::LdapStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,LdapStrategy *this,
          Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Path local_88;
  Url local_68;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  paVar1 = &local_88.value_.field_2;
  pcVar2 = (this->username_)._M_dataplus._M_p;
  local_88.value_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (this->username_)._M_string_length);
  getUrl(&local_68,client,&local_88);
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/LdapStrategy.cpp:12:55)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/LdapStrategy.cpp:12:55)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_68,(NoArgJsonProducer *)&local_48)
  ;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.value_._M_dataplus._M_p != &local_68.value_.field_2) {
    operator_delete(local_68.value_._M_dataplus._M_p,
                    local_68.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.value_._M_dataplus._M_p,
                    local_88.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::LdapStrategy::authenticate(const Vault::Client &client) {
  return Vault::HttpConsumer::authenticate(
      client, getUrl(client, Vault::Path{username_}), [&]() {
        nlohmann::json j;
        j = nlohmann::json::object();
        j["password"] = password_;
        return j.dump();
      });
}